

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

IReporter *
doctest::detail::reporterCreator<doctest::(anonymous_namespace)::ConsoleReporter>(ContextOptions *o)

{
  IReporter *pIVar1;
  
  pIVar1 = (IReporter *)operator_new(0x70);
  pIVar1->_vptr_IReporter = (_func_int **)&PTR_report_query_00120ca0;
  pIVar1[1]._vptr_IReporter = (_func_int **)o->cout;
  pIVar1[5]._vptr_IReporter = (_func_int **)0x0;
  pIVar1[3]._vptr_IReporter = (_func_int **)0x0;
  pIVar1[4]._vptr_IReporter = (_func_int **)0x0;
  pIVar1[0xb]._vptr_IReporter = (_func_int **)0x0;
  pIVar1[9]._vptr_IReporter = (_func_int **)0x0;
  pIVar1[10]._vptr_IReporter = (_func_int **)0x0;
  pIVar1[7]._vptr_IReporter = (_func_int **)0x0;
  pIVar1[8]._vptr_IReporter = (_func_int **)0x0;
  pIVar1[0xc]._vptr_IReporter = (_func_int **)o;
  return pIVar1;
}

Assistant:

IReporter* reporterCreator(const ContextOptions& o) {
        return new Reporter(o);
    }